

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O2

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset,bool *is_complete)

{
  uint new_num_strips;
  int iVar1;
  size_t sVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  unsigned_long uVar6;
  pointer __src;
  size_t j;
  unsigned_long uVar7;
  ulong uVar8;
  long lVar9;
  allocator_type local_81;
  unsigned_long __n2;
  Data2D<int> *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  bool *local_68;
  size_t local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> dad;
  
  sVar2 = mset->num_dimensions;
  new_num_strips = mset->cache_num_indexes;
  local_68 = is_complete;
  Data2D<int>::Data2D<int,int>(__return_storage_ptr__,(int)sVar2,new_num_strips);
  local_60 = sVar2 * 4;
  local_70 = &__return_storage_ptr__->vec;
  uVar8 = 0;
  local_58 = (ulong)new_num_strips;
  if ((int)new_num_strips < 1) {
    local_58 = uVar8;
  }
  bVar4 = false;
  __n2 = sVar2;
  local_78 = __return_storage_ptr__;
  while (uVar6 = __n2, uVar8 != local_58) {
    __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + mset->num_dimensions * uVar8;
    ::std::vector<int,_std::allocator<int>_>::vector(&dad,__n2,&local_81);
    if (uVar6 != 0) {
      memmove(dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,__src,local_60);
      uVar6 = __n2;
    }
    lVar9 = local_78->stride * uVar8;
    piVar3 = (local_78->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = uVar8;
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      iVar5 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar7];
      if (iVar5 == 0) {
        piVar3[lVar9 + uVar7] = -1;
      }
      else {
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar7] = (iVar5 + 1) / 2 - (uint)(iVar5 < 4);
        iVar5 = MultiIndexSet::getSlot
                          (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        piVar3[lVar9 + uVar7] = iVar5;
        if (iVar5 == -1) {
          bVar4 = true;
        }
        while( true ) {
          iVar1 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar7];
          if ((iVar1 == 0) || (iVar5 != -1)) break;
          dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar7] = (iVar1 + 1) / 2 - (uint)(iVar1 < 4);
          iVar5 = MultiIndexSet::getSlot
                            (mset,dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          piVar3[lVar9 + uVar7] = iVar5;
        }
        dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar7] = __src[uVar7];
        uVar6 = __n2;
      }
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dad.super__Vector_base<int,_std::allocator<int>_>);
    uVar8 = local_50 + 1;
  }
  *local_68 = !bVar4;
  return local_78;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset, bool &is_complete){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] >= level0_offset){
                        int current = p[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                        if (pp[2*j] == -1)
                            fail = 1;
                        while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                            current = dad[j];
                            dad[j] = RuleLocal::getParent<effrule>(current);
                            pp[2*j] = mset.getSlot(dad);
                        }
                        dad[j] = RuleLocal::getStepParent<effrule>(current);
                        if (dad[j] != -1){
                            pp[2*j + 1] = mset.getSlot(dad);
                            if (pp[2*j + 1] == -1)
                                fail = 1;
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] == 0){
                        pp[j] = -1;
                    }else{
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad.data());
                        if (pp[j] == -1)
                            fail = 1;
                        while((dad[j] != 0) && (pp[j] == -1)){
                            dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                            pp[j] = mset.getSlot(dad);
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }
}